

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O1

QTime __thiscall QLocale::toTime(QLocale *this,QString *string,QString *format)

{
  bool bVar1;
  long in_FS_OFFSET;
  QStringView newFormat;
  QDateTimeParser dt;
  QCalendar local_d8;
  QDateTimeParser local_d0;
  QTime local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_34.mds = -1;
  memset(&local_d0,0xaa,0x98);
  QCalendar::QCalendar(&local_d8);
  QDateTimeParser::QDateTimeParser(&local_d0,QTime,FromString,local_d8);
  QSharedDataPointer<QLocalePrivate>::reset(&local_d0.defaultLocale.d,(this->d).d.ptr);
  newFormat.m_data = (format->d).ptr;
  newFormat.m_size = (format->d).size;
  bVar1 = QDateTimeParser::parseFormat(&local_d0,newFormat);
  if (bVar1) {
    QDateTimeParser::fromString(&local_d0,string,(QDate *)0x0,&local_34,0x76c);
  }
  QDateTimeParser::~QDateTimeParser(&local_d0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QTime)local_34.mds;
  }
  __stack_chk_fail();
}

Assistant:

QTime QLocale::toTime(const QString &string, const QString &format) const
{
    QTime time;
#if QT_CONFIG(datetimeparser)
    QDateTimeParser dt(QMetaType::QTime, QDateTimeParser::FromString, QCalendar());
    dt.setDefaultLocale(*this);
    if (dt.parseFormat(format))
        dt.fromString(string, nullptr, &time);
#else
    Q_UNUSED(string);
    Q_UNUSED(format);
#endif
    return time;
}